

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
               (appender *out,unsigned___int128 value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  basic_format_specs<char> *in_RDX;
  digit_grouping<char> *in_RSI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *in_RDI;
  undefined1 in_stack_00000000 [16];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_00000028;
  digit_grouping<char> grouping;
  bool in_stack_ffffffffffffff97;
  digit_grouping<char> *in_stack_ffffffffffffff98;
  locale_ref in_stack_ffffffffffffffa0;
  uint in_stack_fffffffffffffffc;
  
  digit_grouping<char>::digit_grouping
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff97);
  bVar1.container =
       (buffer<char> *)
       write_int_localized<fmt::v8::appender,unsigned__int128,char>
                 (in_stack_00000028.container,(unsigned___int128)in_stack_00000000,
                  in_stack_fffffffffffffffc,in_RDX,in_RSI);
  in_RDI->container = bVar1.container;
  digit_grouping<char>::~digit_grouping((digit_grouping<char> *)0x1b48db);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}